

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O0

insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
__thiscall
glu::(anonymous_namespace)::
namedBindingsToProgramLocations<glu::VertexArrayBinding_const*,std::insert_iterator<std::vector<glu::VertexArrayBinding,std::allocator<glu::VertexArrayBinding>>>>
          (_anonymous_namespace_ *this,Functions *gl,deUint32 program,VertexArrayBinding *first,
          VertexArrayBinding *end,
          insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
          out)

{
  code *pcVar1;
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  iVar2;
  BindingPoint *__value;
  undefined4 uVar3;
  undefined8 uVar4;
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  *piVar5;
  undefined4 in_register_00000014;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *in_R9;
  BindingPoint local_e0;
  VertexArrayBinding local_b0;
  int local_5c;
  BindingPoint *pBStack_58;
  int location;
  BindingPoint *binding;
  VertexArrayBinding *cur;
  VertexArrayBinding *end_local;
  VertexArrayBinding *first_local;
  _anonymous_namespace_ *p_Stack_30;
  deUint32 program_local;
  Functions *gl_local;
  insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
  out_local;
  
  first_local._4_4_ = SUB84(gl,0);
  binding = (BindingPoint *)CONCAT44(in_register_00000014,program);
  cur = first;
  end_local = (VertexArrayBinding *)binding;
  p_Stack_30 = this;
  gl_local = (Functions *)end;
  out_local.container = in_R9;
  for (; uVar3 = first_local._4_4_, __value = binding, (VertexArrayBinding *)binding != cur;
      binding = (BindingPoint *)((long)&binding[1].name.field_2 + 8)) {
    pBStack_58 = binding;
    if (binding->type == TYPE_NAME) {
      pcVar1 = *(code **)(p_Stack_30 + 0x780);
      uVar4 = std::__cxx11::string::c_str();
      local_5c = (*pcVar1)(uVar3,uVar4);
      if (-1 < local_5c) {
        BindingPoint::BindingPoint(&local_e0,local_5c + pBStack_58->location);
        VertexArrayBinding::VertexArrayBinding
                  (&local_b0,&local_e0,(VertexArrayPointer *)(binding + 1));
        piVar5 = std::
                 insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                 ::operator*((insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                              *)&gl_local);
        std::
        insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
        ::operator=(piVar5,&local_b0);
        VertexArrayBinding::~VertexArrayBinding(&local_b0);
        BindingPoint::~BindingPoint(&local_e0);
        std::
        insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
        ::operator++((insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                      *)&gl_local);
      }
    }
    else {
      piVar5 = std::
               insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
               ::operator*((insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                            *)&gl_local);
      std::
      insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
      ::operator=(piVar5,(value_type *)__value);
      std::
      insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
      ::operator++((insert_iterator<std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>_>
                    *)&gl_local);
    }
  }
  iVar2.iter._M_current = (VertexArrayBinding *)out_local.container;
  iVar2.container =
       (vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)gl_local;
  return iVar2;
}

Assistant:

static OutputIter namedBindingsToProgramLocations (const glw::Functions& gl, deUint32 program, InputIter first, InputIter end, OutputIter out)
{
	for (InputIter cur = first; cur != end; ++cur)
	{
		const BindingPoint& binding = cur->binding;
		if (binding.type == BindingPoint::TYPE_NAME)
		{
			DE_ASSERT(binding.location >= 0);
			int location = gl.getAttribLocation(program, binding.name.c_str());
			if (location >= 0)
			{
				// Add binding.location as an offset to accommodate matrices.
				*out = VertexArrayBinding(BindingPoint(location + binding.location), cur->pointer);
				++out;
			}
		}
		else
		{
			*out = *cur;
			++out;
		}
	}

	return out;
}